

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.c
# Opt level: O0

LY_ERR structure_compile(lysc_ctx *cctx,lysp_ext_instance *extp,lysc_ext_instance *ext)

{
  uint32_t uVar1;
  char *pcVar2;
  int iVar3;
  LY_ERR LVar4;
  uint32_t *puVar5;
  char *pcVar6;
  void **ppvVar7;
  long *plVar8;
  char *p__;
  uint32_t prev_options;
  lysc_ext_instance_structure *struct_cdata;
  lysc_node *child;
  lysc_module *mod_c;
  LY_ERR rc;
  lysc_ext_instance *ext_local;
  lysp_ext_instance *extp_local;
  lysc_ctx *cctx_local;
  
  puVar5 = lyplg_ext_compile_get_options(cctx);
  uVar1 = *puVar5;
  for (struct_cdata = *(lysc_ext_instance_structure **)((long)ext->parent + 8);
      struct_cdata != (lysc_ext_instance_structure *)0x0;
      struct_cdata = (lysc_ext_instance_structure *)struct_cdata->ref) {
    iVar3 = strcmp((char *)struct_cdata[1].musts,ext->argument);
    if (iVar3 == 0) {
      pcVar2 = extp->name;
      pcVar6 = lys_nodetype2str(*(uint16_t *)&struct_cdata->musts);
      lyplg_ext_compile_log
                (cctx,ext,LY_LLERR,LY_EVALID,
                 "Extension %s collides with a %s with the same identifier.",pcVar2,pcVar6);
      return LY_EVALID;
    }
  }
  ppvVar7 = (void **)calloc(1,0x28);
  if (ppvVar7 != (void **)0x0) {
    ext->compiled = ppvVar7;
    if (ext->substmts == (lysc_ext_substmt *)0x0) {
      plVar8 = (long *)calloc(1,0xe8);
    }
    else {
      plVar8 = (long *)realloc(&ext->substmts[-1].storage_p,
                               ((long)ext->substmts[-1].storage_p + 0xe) * 0x10 + 8);
    }
    if (plVar8 != (long *)0x0) {
      ext->substmts = (lysc_ext_substmt *)(plVar8 + 1);
      if (ext->substmts != (lysc_ext_substmt *)0x0) {
        memset(ext->substmts + *plVar8,0,0xe0);
      }
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts->stmt = LY_STMT_MUST;
      ext->substmts->storage_p = ppvVar7;
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts[1].stmt = LY_STMT_STATUS;
      ext->substmts[1].storage_p = ppvVar7 + 1;
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts[2].stmt = LY_STMT_DESCRIPTION;
      ext->substmts[2].storage_p = ppvVar7 + 2;
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts[3].stmt = LY_STMT_REFERENCE;
      ext->substmts[3].storage_p = ppvVar7 + 3;
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts[4].stmt = LY_STMT_TYPEDEF;
      ext->substmts[4].storage_p = (void **)0x0;
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts[5].stmt = LY_STMT_GROUPING;
      ext->substmts[5].storage_p = (void **)0x0;
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts[6].stmt = LY_STMT_CONTAINER;
      ext->substmts[6].storage_p = ppvVar7 + 4;
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts[7].stmt = LY_STMT_LEAF;
      ext->substmts[7].storage_p = ppvVar7 + 4;
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts[8].stmt = LY_STMT_LEAF_LIST;
      ext->substmts[8].storage_p = ppvVar7 + 4;
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts[9].stmt = LY_STMT_LIST;
      ext->substmts[9].storage_p = ppvVar7 + 4;
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts[10].stmt = LY_STMT_CHOICE;
      ext->substmts[10].storage_p = ppvVar7 + 4;
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts[0xb].stmt = LY_STMT_ANYDATA;
      ext->substmts[0xb].storage_p = ppvVar7 + 4;
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts[0xc].stmt = LY_STMT_ANYXML;
      ext->substmts[0xc].storage_p = ppvVar7 + 4;
      ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
      ext->substmts[0xd].stmt = LY_STMT_USES;
      ext->substmts[0xd].storage_p = ppvVar7 + 4;
      puVar5 = lyplg_ext_compile_get_options(cctx);
      *puVar5 = *puVar5 | 0xc;
      LVar4 = lyplg_ext_compile_extension_instance(cctx,extp,ext);
      puVar5 = lyplg_ext_compile_get_options(cctx);
      *puVar5 = uVar1;
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      return LY_SUCCESS;
    }
  }
  lyplg_ext_compile_log
            (cctx,ext,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","structure_compile");
  return LY_EMEM;
}

Assistant:

static LY_ERR
structure_compile(struct lysc_ctx *cctx, const struct lysp_ext_instance *extp, struct lysc_ext_instance *ext)
{
    LY_ERR rc;
    struct lysc_module *mod_c;
    const struct lysc_node *child;
    struct lysc_ext_instance_structure *struct_cdata;
    uint32_t prev_options = *lyplg_ext_compile_get_options(cctx);

    mod_c = ext->parent;

    /* check identifier namespace with the compiled nodes */
    LY_LIST_FOR(mod_c->data, child) {
        if (!strcmp(child->name, ext->argument)) {
            /* identifier collision */
            lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EVALID,  "Extension %s collides with a %s with the same identifier.",
                    extp->name, lys_nodetype2str(child->nodetype));
            return LY_EVALID;
        }
    }

    /* allocate the storage */
    struct_cdata = calloc(1, sizeof *struct_cdata);
    if (!struct_cdata) {
        goto emem;
    }
    ext->compiled = struct_cdata;

    /* compile substatements */
    LY_ARRAY_CREATE_GOTO(cctx->ctx, ext->substmts, 14, rc, emem);
    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[0].stmt = LY_STMT_MUST;
    ext->substmts[0].storage_p = (void **)&struct_cdata->musts;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[1].stmt = LY_STMT_STATUS;
    ext->substmts[1].storage_p = (void **)&struct_cdata->flags;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[2].stmt = LY_STMT_DESCRIPTION;
    ext->substmts[2].storage_p = (void **)&struct_cdata->dsc;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[3].stmt = LY_STMT_REFERENCE;
    ext->substmts[3].storage_p = (void **)&struct_cdata->ref;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[4].stmt = LY_STMT_TYPEDEF;
    ext->substmts[4].storage_p = 0;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[5].stmt = LY_STMT_GROUPING;
    ext->substmts[5].storage_p = 0;

    /* data-def-stmt */
    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[6].stmt = LY_STMT_CONTAINER;
    ext->substmts[6].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[7].stmt = LY_STMT_LEAF;
    ext->substmts[7].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[8].stmt = LY_STMT_LEAF_LIST;
    ext->substmts[8].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[9].stmt = LY_STMT_LIST;
    ext->substmts[9].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[10].stmt = LY_STMT_CHOICE;
    ext->substmts[10].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[11].stmt = LY_STMT_ANYDATA;
    ext->substmts[11].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[12].stmt = LY_STMT_ANYXML;
    ext->substmts[12].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[13].stmt = LY_STMT_USES;
    ext->substmts[13].storage_p = (void **)&struct_cdata->child;

    *lyplg_ext_compile_get_options(cctx) |= LYS_COMPILE_NO_CONFIG | LYS_COMPILE_NO_DISABLED;
    rc = lyplg_ext_compile_extension_instance(cctx, extp, ext);
    *lyplg_ext_compile_get_options(cctx) = prev_options;
    if (rc) {
        return rc;
    }

    return LY_SUCCESS;

emem:
    lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EMEM, "Memory allocation failed (%s()).", __func__);
    return LY_EMEM;
}